

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Server_forEachChildNodeCall
          (UA_Server *server,UA_NodeId parentNodeId,UA_NodeIteratorCallback callback,void *handle)

{
  UA_ReferenceNode *size;
  UA_NodeId *pUVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  UA_Node *pUVar4;
  size_t sVar5;
  UA_NodeId *pUVar6;
  bool bVar7;
  void *local_48;
  UA_ReferenceNode *refs;
  void *local_38;
  
  pUVar4 = UA_NodeStore_get(server->nodestore,&parentNodeId);
  if (pUVar4 == (UA_Node *)0x0) {
    UVar2 = 0x80330000;
  }
  else {
    local_48 = (void *)0x0;
    size = (UA_ReferenceNode *)pUVar4->referencesSize;
    UVar2 = UA_Array_copy(pUVar4->references,(size_t)size,&local_48,UA_TYPES + 0x38);
    if (UVar2 == 0) {
      sVar5 = pUVar4->referencesSize;
      local_38 = local_48;
      UVar2 = 0;
      pUVar1 = (UA_NodeId *)(sVar5 * 0x50 + (long)local_48);
      refs = size;
      while( true ) {
        pUVar6 = (UA_NodeId *)((long)&pUVar1[-4].identifier + 8);
        bVar7 = sVar5 == 0;
        sVar5 = sVar5 - 1;
        if (bVar7) break;
        UVar3 = (*callback)(pUVar1[-2],(UA_Boolean)pUVar1[-3].identifier.guid.data4[0],*pUVar6,
                            handle);
        UVar2 = UVar2 | UVar3;
        pUVar1 = pUVar6;
      }
      UA_Array_delete(local_38,(size_t)refs,UA_TYPES + 0x38);
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_Server_forEachChildNodeCall(UA_Server *server, UA_NodeId parentNodeId,
                               UA_NodeIteratorCallback callback, void *handle) {
    UA_RCU_LOCK();
    const UA_Node *parent = UA_NodeStore_get(server->nodestore, &parentNodeId);
    if(!parent) {
        UA_RCU_UNLOCK();
        return UA_STATUSCODE_BADNODEIDINVALID;
    }

    /* TODO: We need to do an ugly copy of the references array since users may
     * delete references from within the callback. In single-threaded mode this
     * changes the same node we point at here. In multi-threaded mode, this
     * creates a new copy as nodes are truly immutable. */
    UA_ReferenceNode *refs = NULL;
    size_t refssize = parent->referencesSize;
    UA_StatusCode retval = UA_Array_copy(parent->references, parent->referencesSize,
                                         (void**)&refs, &UA_TYPES[UA_TYPES_REFERENCENODE]);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_RCU_UNLOCK();
        return retval;
    }

    for(size_t i = parent->referencesSize; i > 0; --i) {
        UA_ReferenceNode *ref = &refs[i-1];
        retval |= callback(ref->targetId.nodeId, ref->isInverse,
                           ref->referenceTypeId, handle);
    }
    UA_RCU_UNLOCK();

    UA_Array_delete(refs, refssize, &UA_TYPES[UA_TYPES_REFERENCENODE]);
    return retval;
}